

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * Diligent::FormatString<char[50]>(string *__return_storage_ptr__,char (*Args) [50])

{
  stringstream local_1a0 [8];
  stringstream ss;
  char (*Args_local) [50];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  FormatStrSS<std::__cxx11::stringstream,char[50]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
             Args);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}